

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec_utils.c
# Opt level: O3

char * apprun_resolve_file_from_path_env(char *filename)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  size_t __n;
  char *pcVar4;
  char resolved [4096];
  char search_paths [4096];
  char local_2038 [4096];
  char local_1038 [4104];
  
  pcVar4 = local_1038;
  memset(pcVar4,0,0x1000);
  memset(local_2038,0,0x1000);
  pcVar2 = getenv("PATH");
  if (pcVar2 == (char *)0x0) {
    confstr(0,local_1038,0x1000);
  }
  else {
    strcpy(local_1038,pcVar2);
  }
  if (local_1038[0] != '\0') {
    sVar3 = strlen(filename);
    do {
      pcVar2 = strchrnul(pcVar4,0x3a);
      __n = (long)pcVar2 - (long)pcVar4;
      if (__n != 0) {
        strncpy(local_2038,pcVar4,__n);
        local_2038[__n] = '/';
        strncpy(local_2038 + __n + 1,filename,sVar3 & 0xffffffff);
        local_2038[__n + (sVar3 & 0xffffffff) + 1] = '\0';
        iVar1 = access(local_2038,0);
        if (iVar1 == 0) {
          filename = local_2038;
          break;
        }
        pcVar4 = pcVar2 + 1;
        local_1038[0] = pcVar2[1];
      }
    } while (local_1038[0] != '\0');
  }
  pcVar4 = strdup(filename);
  return pcVar4;
}

Assistant:

char* apprun_resolve_file_from_path_env(const char* filename) {
    char search_paths[PATH_MAX] = {0x0};
    char resolved[PATH_MAX] = {0x0};

    // use PATH env or fallback to confstr(_CS_PATH)
    char* path_env = getenv("PATH");
    if (path_env != NULL)
        strcpy(search_paths, path_env);
    else
        confstr(_CS_PATH, search_paths, PATH_MAX);

    unsigned filename_len = strlen(filename);

    char* itr_begin = search_paths;
    char* itr_end = NULL;
    while (itr_begin != NULL && *itr_begin != '\0') {
        itr_end = strchrnul(itr_begin, ':');
        size_t path_len = itr_end - itr_begin;
        if (path_len > 0) {
            strncpy(resolved, itr_begin, path_len);
            resolved[path_len] = '/';
            strncpy(resolved + path_len + 1, filename, filename_len);
            resolved[path_len + filename_len + 1] = '\0';

            if (access(resolved, F_OK) == 0)
                return strdup(resolved);

            itr_begin = itr_end + 1;
        }
    }

    return strdup(filename);
}